

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O3

void __thiscall duckdb::ArenaChunk::~ArenaChunk(ArenaChunk *this)

{
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> _Var1;
  pointer __old_p;
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> _Var2;
  
  _Var2._M_head_impl =
       (this->next).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (ArenaChunk *)0x0) {
    (this->next).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
    .super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
    super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
    do {
      _Var1._M_head_impl =
           *(ArenaChunk **)
            &((unsafe_unique_ptr<ArenaChunk> *)((long)_Var2._M_head_impl + 0x28))->
             super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>;
      *(undefined8 *)((long)_Var2._M_head_impl + 0x28) = 0;
      ~ArenaChunk(_Var2._M_head_impl);
      operator_delete(_Var2._M_head_impl);
      _Var2._M_head_impl = _Var1._M_head_impl;
    } while ((tuple<duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>)
             _Var1._M_head_impl != (_Head_base<0UL,_duckdb::ArenaChunk_*,_false>)0x0);
    _Var2._M_head_impl =
         (this->next).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>
         ._M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>
         .super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
    if (_Var2._M_head_impl != (ArenaChunk *)0x0) {
      ~ArenaChunk(_Var2._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
  }
  (this->next).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
  super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
  AllocatedData::~AllocatedData(&this->data);
  return;
}

Assistant:

ArenaChunk::~ArenaChunk() {
	if (next) {
		auto current_next = std::move(next);
		while (current_next) {
			current_next = std::move(current_next->next);
		}
	}
}